

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec4i __thiscall embree::XMLLoader::load<embree::Vec4<int>>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  runtime_error *this_01;
  long *in_RDX;
  undefined8 extraout_RDX;
  Vec4i VVar5;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0x120) {
    iVar1 = Token::Int(this_00);
    iVar2 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + 0x48));
    iVar3 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + 0x90));
    iVar4 = Token::Int((Token *)(*(long *)(*in_RDX + 0x98) + 0xd8));
    *(int *)&(this->path).filename._M_dataplus._M_p = iVar1;
    *(int *)((long)&(this->path).filename._M_dataplus._M_p + 4) = iVar2;
    *(int *)&(this->path).filename._M_string_length = iVar3;
    *(int *)((long)&(this->path).filename._M_string_length + 4) = iVar4;
    VVar5.field_0._8_8_ = extraout_RDX;
    VVar5.field_0._0_8_ = this;
    return (Vec4i)VVar5.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&sStack_68,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+(&local_48,&sStack_68,": wrong int4 body");
  std::runtime_error::runtime_error(this_01,(string *)&local_48);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec4i XMLLoader::load<Vec4i>(const Ref<XML>& xml) {
    if (xml->body.size() != 4) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong int4 body");
    return Vec4i(xml->body[0].Int(),xml->body[1].Int(),xml->body[2].Int(),xml->body[3].Int());
  }